

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O3

void __thiscall
duckdb::SumRewriterOptimizer::RewriteSums
          (SumRewriterOptimizer *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  ExpressionType EVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  long *plVar4;
  Optimizer *pOVar5;
  __uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
  _Var6;
  ColumnBinding binding;
  undefined8 uVar7;
  SumRewriterOptimizer *pSVar8;
  undefined8 uVar9;
  int iVar10;
  pointer pLVar11;
  LogicalAggregate *pLVar12;
  reference pvVar13;
  pointer pEVar14;
  type pEVar15;
  reference pvVar16;
  BoundAggregateExpression *pBVar17;
  BoundFunctionExpression *pBVar18;
  pointer pEVar19;
  mapped_type *pmVar20;
  BoundColumnRefExpression *this_00;
  BoundColumnRefExpression *this_01;
  LogicalProjection *this_02;
  pointer pLVar21;
  long lVar22;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_03;
  pointer puVar23;
  undefined8 *puVar24;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *puVar25;
  LogicalType *other;
  undefined1 *__n;
  ClientContext *pCVar26;
  byte bVar27;
  ColumnBinding binding_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_expressions;
  FunctionBinder function_binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  constants;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  rewrote_map;
  AggregateFunction count_fun;
  undefined1 local_410 [8];
  undefined1 local_408 [16];
  undefined1 local_3f8 [32];
  ClientContext *local_3d8;
  optional_ptr<duckdb::LogicalOperator,_true> local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3a8;
  init_cast_local_state_t local_3a0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_398;
  LogicalType *local_378;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_370;
  FunctionBinder local_368;
  pointer local_358;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *local_350;
  _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_348;
  SumRewriterOptimizer *local_340;
  ClientContext *local_338;
  undefined1 local_330 [24];
  undefined1 local_318 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_2e8;
  undefined1 local_2d0 [56];
  undefined1 local_298 [16];
  BoundColumnRefExpression local_288;
  undefined1 auStack_208 [168];
  BaseScalarFunction local_160;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_b0 [14];
  undefined8 local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar27 = 0;
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(op);
  pLVar12 = LogicalOperator::Cast<duckdb::LogicalAggregate>(pLVar11);
  if ((pLVar12->groups).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pLVar12->groups).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2d0._0_8_ = local_2d0 + 0x30;
    local_2d0._8_8_ = &DAT_00000001;
    local_2d0._16_8_ = (pointer)0x0;
    local_2d0._24_8_ = (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0;
    local_2d0._32_4_ = 1.0;
    local_2d0._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2d0._48_8_ = (__node_base_ptr)0x0;
    local_318._16_8_ = (pointer)0x0;
    local_318._0_8_ = 0;
    local_318._8_8_ = 0;
    puVar23 = (pLVar12->super_LogicalOperator).expressions.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pLVar12->super_LogicalOperator).expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_408._0_8_ = (ClientContext *)0x0;
    lVar22 = (long)puVar2 - (long)puVar23;
    if (lVar22 != 0) {
      local_370 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                   *)&(pLVar12->super_LogicalOperator).expressions;
      local_338 = (ClientContext *)(lVar22 >> 3);
      local_378 = &local_160.return_type;
      local_3d8 = (ClientContext *)auStack_208;
      local_350 = local_b0;
      local_348 = (_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&PTR__BaseScalarFunction_0243ff60;
      local_358 = puVar23;
      local_340 = this;
      local_330._16_8_ = pLVar12;
      local_2f8._M_allocated_capacity = (size_type)op;
      local_2f8._8_8_ = puVar2;
      do {
        pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                *)local_370,local_408._0_8_);
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pEVar14 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                  ::operator->(&this->sum_matcher);
        pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar13);
        iVar10 = (*pEVar14->_vptr_ExpressionMatcher[2])(pEVar14,pEVar15,&local_398);
        if ((char)iVar10 != '\0') {
          pvVar16 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                              ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                               &local_398,0);
          pBVar17 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                              (&pvVar16->_M_data->super_BaseExpression);
          pvVar16 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                              ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                               &local_398,1);
          pBVar18 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                              (&pvVar16->_M_data->super_BaseExpression);
          this_03 = &pBVar18->children;
          pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](this_03,0);
          pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar13);
          EVar1 = (pEVar19->super_BaseExpression).type;
          pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](this_03,(ulong)(EVar1 != VALUE_CONSTANT));
          local_408._8_8_ =
               (pvVar13->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](this_03,(ulong)(EVar1 == VALUE_CONSTANT));
          local_368.context =
               (ClientContext *)
               (pvVar13->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_368.context);
          (*(pEVar19->super_BaseExpression)._vptr_BaseExpression[0x11])(local_298);
          pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&pBVar17->children,0);
          uVar9 = local_298._0_8_;
          local_298._0_8_ = (element_type *)0x0;
          _Var3._M_head_impl =
               (pvVar13->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar9;
          if (_Var3._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          if ((element_type *)local_298._0_8_ != (element_type *)0x0) {
            (*(*(_func_int ***)local_298._0_8_)[1])();
          }
          FunctionBinder::FunctionBinder((FunctionBinder *)local_330,local_340->optimizer->context);
          CountFunctionBase::GetFunction();
          local_3f8._0_8_ = (pointer)0x0;
          local_3f8._8_8_ = (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0;
          local_3f8._16_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_3f8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_368.context);
          SimpleFunction::SimpleFunction
                    ((SimpleFunction *)(auStack_208 + 0xa8),(SimpleFunction *)local_298);
          local_160.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_348;
          LogicalType::LogicalType(local_378,(LogicalType *)local_3d8);
          local_160.stability = auStack_208[0x18];
          local_160.null_handling = auStack_208[0x19];
          local_160.errors = auStack_208[0x1a];
          local_160.collation_handling = auStack_208[0x1b];
          local_160.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__AggregateFunction_02433f70;
          puVar24 = (undefined8 *)(auStack_208 + 0x20);
          puVar25 = local_350;
          for (lVar22 = 0xd; lVar22 != 0; lVar22 = lVar22 + -1) {
            (puVar25->_M_t).
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)*puVar24
            ;
            puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
            puVar25 = puVar25 + (ulong)bVar27 * -2 + 1;
          }
          *(undefined2 *)
           &local_350[0xd]._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = auStack_208._136_2_;
          local_40 = auStack_208._144_8_;
          local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_208._152_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_208._152_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(auStack_208._152_8_ + 8) =
                   *(_Atomic_word *)(auStack_208._152_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(auStack_208._152_8_ + 8) =
                   *(_Atomic_word *)(auStack_208._152_8_ + 8) + 1;
            }
          }
          local_2e8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3f8._0_8_;
          local_2e8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3f8._8_8_;
          local_2e8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3f8._16_8_;
          local_3f8._0_8_ = (pointer)0x0;
          local_3f8._8_8_ = (pointer)0x0;
          local_3f8._16_8_ = (pointer)0x0;
          local_3a0 = (init_cast_local_state_t)0x0;
          FunctionBinder::BindAggregateFunction
                    (&local_368,(AggregateFunction *)local_330,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)(auStack_208 + 0xa8),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_2e8,(AggregateType)&local_3a0);
          if (local_3a0 != (init_cast_local_state_t)0x0) {
            (**(code **)(*(long *)local_3a0 + 8))();
          }
          local_3a0 = (init_cast_local_state_t)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector(&local_2e8);
          local_160.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__AggregateFunction_02433f70;
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)(auStack_208 + 0xa8));
          local_410 = (undefined1  [8])local_368.binder.ptr;
          local_368.binder.ptr = (Binder *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    (local_370,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_410);
          if (local_410 != (undefined1  [8])0x0) {
            (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                         &((BaseExpression *)local_410)->_vptr_BaseExpression)->internal).
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_318,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)(local_408 + 8));
          local_410 = (undefined1  [8])local_2d0;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_410,local_408,local_410);
          if (local_368.binder.ptr != (Binder *)0x0) {
            (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_3f8);
          local_298._0_8_ = &PTR__AggregateFunction_02433f70;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_208._152_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_208._152_8_);
          }
          BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
          if (local_368.context != (ClientContext *)0x0) {
            (*((BaseExpression *)
              &(local_368.context)->super_enable_shared_from_this<duckdb::ClientContext>)->
              _vptr_BaseExpression[1])();
          }
          if ((Expression *)local_408._8_8_ != (Expression *)0x0) {
            (**(code **)(*(long *)local_408._8_8_ + 8))();
          }
        }
        if ((BoundCastData *)
            local_398.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (BoundCastData *)0x0) {
          operator_delete(local_398.
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        pSVar8 = local_340;
        local_408._0_8_ =
             (long)&(((enable_shared_from_this<duckdb::ClientContext> *)local_408._0_8_)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      } while ((ulong)local_408._0_8_ < local_338);
      if ((BoundCastData *)local_2d0._24_8_ != (BoundCastData *)0x0) {
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_378 = (LogicalType *)Binder::GenerateTableIndex(local_340->optimizer->binder);
        if ((pointer)local_2f8._8_8_ != local_358) {
          local_348 = (_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pSVar8->aggregate_map;
          local_350 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      ((long)&(local_338->super_enable_shared_from_this<duckdb::ClientContext>).
                              __weak_this_.internal.
                              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + (ulong)(local_338 == (ClientContext *)0x0));
          local_3d8 = (ClientContext *)0x0;
          puVar23 = (pointer)0x0;
          pLVar12 = (LogicalAggregate *)local_330._16_8_;
          pCVar26 = local_338;
          do {
            local_3f8._0_8_ = pLVar12->aggregate_index;
            local_3f8._8_8_ = puVar23;
            pmVar20 = ::std::__detail::
                      _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_348,(key_type *)local_3f8);
            pmVar20->table_index = (idx_t)local_378;
            pmVar20->column_index = (idx_t)puVar23;
            pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                    *)local_370,(size_type)puVar23);
            pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(pvVar13);
            this_00 = (BoundColumnRefExpression *)operator_new(0x70);
            other = &pEVar19->return_type;
            LogicalType::LogicalType((LogicalType *)local_298,other);
            binding.column_index = local_3f8._8_8_;
            binding.table_index = local_3f8._0_8_;
            BoundColumnRefExpression::BoundColumnRefExpression
                      (this_00,(LogicalType *)local_298,binding,0);
            LogicalType::~LogicalType((LogicalType *)local_298);
            if (*(long **)((LogicalTypeId *)local_2d0._0_8_ +
                          ((ulong)puVar23 % (ulong)local_2d0._8_8_) * 8) != (long *)0x0) {
              plVar4 = (long *)**(long **)((LogicalTypeId *)local_2d0._0_8_ +
                                          ((ulong)puVar23 % (ulong)local_2d0._8_8_) * 8);
              puVar2 = (pointer)plVar4[1];
              do {
                if (puVar23 == puVar2) {
                  __n = (undefined1 *)
                        ((long)&(pCVar26->super_enable_shared_from_this<duckdb::ClientContext>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + (long)local_3d8);
                  local_358 = (pointer)pLVar12->aggregate_index;
                  pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                          *)local_370,(size_type)__n);
                  pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(pvVar13);
                  this_01 = (BoundColumnRefExpression *)operator_new(0x70);
                  LogicalType::LogicalType((LogicalType *)local_298,&pEVar19->return_type);
                  binding_00.column_index = (idx_t)__n;
                  binding_00.table_index = (idx_t)local_358;
                  BoundColumnRefExpression::BoundColumnRefExpression
                            (this_01,(LogicalType *)local_298,binding_00,0);
                  pSVar8 = local_340;
                  LogicalType::~LogicalType((LogicalType *)local_298);
                  local_3a8._M_head_impl = (Expression *)this_01;
                  BoundCastExpression::AddCastToType
                            ((BoundCastExpression *)local_330,pSVar8->optimizer->context,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_3a8,other,false);
                  if ((BoundColumnRefExpression *)local_3a8._M_head_impl !=
                      (BoundColumnRefExpression *)0x0) {
                    (*(((Expression *)&(local_3a8._M_head_impl)->super_BaseExpression)->
                      super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_3a8._M_head_impl = (Expression *)0x0;
                  pCVar26 = pSVar8->optimizer->context;
                  pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                          *)local_318,(size_type)local_3d8);
                  local_3b0._M_head_impl =
                       (pvVar13->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                  (pvVar13->
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                       (Expression *)0x0;
                  BoundCastExpression::AddCastToType
                            ((BoundCastExpression *)local_410,pCVar26,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_3b0,other,false);
                  if (local_3b0._M_head_impl != (Expression *)0x0) {
                    (*((local_3b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_3b0._M_head_impl = (Expression *)0x0;
                  pOVar5 = pSVar8->optimizer;
                  local_298._0_8_ = local_298 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_298,anon_var_dwarf_4ed1a7a + 8,
                             anon_var_dwarf_4ed1a7a + 9);
                  local_3b8._M_head_impl = (Expression *)local_330._0_8_;
                  local_330._0_8_ = (Binder *)0x0;
                  local_3c0._M_head_impl = (Expression *)local_410;
                  local_410 = (undefined1  [8])0x0;
                  Optimizer::BindScalarFunction
                            ((Optimizer *)local_408,(string *)pOVar5,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_298,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_3b8);
                  if (local_3c0._M_head_impl != (Expression *)0x0) {
                    (*((local_3c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_3c0._M_head_impl = (Expression *)0x0;
                  if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_3b8._M_head_impl !=
                      (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
                    (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                                 &((local_3b8._M_head_impl)->super_BaseExpression).
                                  _vptr_BaseExpression)->internal).
                                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                              .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)();
                  }
                  local_3b8._M_head_impl = (Expression *)0x0;
                  if ((element_type *)local_298._0_8_ != (element_type *)(local_298 + 0x10)) {
                    operator_delete((void *)local_298._0_8_);
                  }
                  pOVar5 = pSVar8->optimizer;
                  local_298._0_8_ = local_298 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"+","");
                  local_3d0.ptr = (LogicalOperator *)local_408._0_8_;
                  local_408._0_8_ = (ClientContext *)0x0;
                  local_3c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
                  Optimizer::BindScalarFunction
                            ((Optimizer *)(local_408 + 8),(string *)pOVar5,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_298,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_3c8);
                  pLVar12 = (LogicalAggregate *)local_330._16_8_;
                  pCVar26 = local_338;
                  if ((ClientContext *)local_3d0.ptr != (ClientContext *)0x0) {
                    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                                 &(local_3d0.ptr)->_vptr_LogicalOperator)->__weak_this_).internal.
                                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).
                              __weak_this_.internal.
                              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)();
                  }
                  local_3d0.ptr = (LogicalOperator *)0x0;
                  if ((BoundColumnRefExpression *)local_3c8._M_pi != (BoundColumnRefExpression *)0x0
                     ) {
                    (*(((Expression *)&(local_3c8._M_pi)->_vptr__Sp_counted_base)->
                      super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_3c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  if ((BoundColumnRefExpression *)local_298._0_8_ !=
                      (BoundColumnRefExpression *)(local_298 + 0x10)) {
                    operator_delete((void *)local_298._0_8_);
                  }
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                              *)&local_398,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)(local_408 + 8));
                  if ((Expression *)local_408._8_8_ != (Expression *)0x0) {
                    (**(code **)(*(long *)local_408._8_8_ + 8))();
                  }
                  if ((ClientContext *)local_408._0_8_ != (ClientContext *)0x0) {
                    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_408._0_8_)
                                ->__weak_this_).internal.
                                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).
                              __weak_this_.internal.
                              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)();
                  }
                  if (local_410 != (undefined1  [8])0x0) {
                    (*((BaseExpression *)local_410)->_vptr_BaseExpression[1])();
                  }
                  if ((Binder *)local_330._0_8_ != (Binder *)0x0) {
                    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_330._0_8_)->
                                __weak_this_).internal.
                                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                              .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)();
                  }
                  local_3d8 = (ClientContext *)
                              ((long)&(local_3d8->
                                      super_enable_shared_from_this<duckdb::ClientContext>).
                                      __weak_this_.internal.
                                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 1);
                  goto LAB_00d4b702;
                }
                plVar4 = (long *)*plVar4;
              } while ((plVar4 != (long *)0x0) &&
                      (puVar2 = (pointer)plVar4[1],
                      (ulong)puVar2 % (ulong)local_2d0._8_8_ ==
                      (ulong)puVar23 % (ulong)local_2d0._8_8_));
            }
            local_298._0_8_ = this_00;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_398,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_298);
            if ((BoundColumnRefExpression *)local_298._0_8_ != (BoundColumnRefExpression *)0x0) {
              (*(((Expression *)local_298._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
LAB_00d4b702:
            puVar23 = (pointer)((long)&(puVar23->
                                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       )._M_t.
                                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                       .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                       _M_head_impl + 1);
          } while ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                   puVar23 != local_350);
        }
        this_02 = (LogicalProjection *)operator_new(0x70);
        local_298._0_8_ =
             local_398.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_298._8_8_ =
             local_398.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_288.super_Expression.super_BaseExpression._vptr_BaseExpression =
             (_func_int **)
             local_398.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogicalProjection::LogicalProjection
                  (this_02,(idx_t)local_378,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_298);
        local_3f8._0_8_ = this_02;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_298);
        uVar9 = local_2f8._M_allocated_capacity;
        pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)local_2f8._M_allocated_capacity);
        if (pLVar11->has_estimated_cardinality == true) {
          pLVar21 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)local_3f8);
          pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                  *)uVar9);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar21->super_LogicalOperator,pLVar11->estimated_cardinality);
        }
        pLVar21 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)local_3f8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar21->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)uVar9);
        uVar7 = local_3f8._0_8_;
        local_3f8._0_8_ =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)0x0;
        _Var6.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             *(__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               *)uVar9;
        *(undefined8 *)uVar9 = uVar7;
        if ((_Var6.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
             (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0)
           && ((**(code **)(*(long *)_Var6.
                                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                     _M_head_impl + 8))(), (pointer)local_3f8._0_8_ != (pointer)0x0)
           ) {
          (**(code **)((long)*(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               *)local_3f8._0_8_ + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector(&local_398);
      }
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_318);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_2d0);
  }
  return;
}

Assistant:

void SumRewriterOptimizer::RewriteSums(unique_ptr<LogicalOperator> &op) {
	auto &aggr = op->Cast<LogicalAggregate>();
	if (!aggr.groups.empty()) {
		return;
	}

	unordered_set<idx_t> rewrote_map;
	vector<unique_ptr<Expression>> constants;
	idx_t aggr_count = aggr.expressions.size();
	for (idx_t i = 0; i < aggr_count; ++i) {
		auto &expr = aggr.expressions[i];
		vector<reference<Expression>> bindings;
		if (!sum_matcher->Match(*expr, bindings)) {
			continue;
		}
		// found SUM(x + C)
		auto &sum = bindings[0].get().Cast<BoundAggregateExpression>();
		auto &addition = bindings[1].get().Cast<BoundFunctionExpression>();
		idx_t const_idx = addition.children[0]->GetExpressionType() == ExpressionType::VALUE_CONSTANT ? 0 : 1;
		auto const_expr = std::move(addition.children[const_idx]);
		auto main_expr = std::move(addition.children[1 - const_idx]);

		// turn this into SUM(x)
		sum.children[0] = main_expr->Copy();

		// push a new aggregate - COUNT(x)
		FunctionBinder function_binder(optimizer.context);

		auto count_fun = CountFunctionBase::GetFunction();
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(main_expr));
		auto count_aggr =
		    function_binder.BindAggregateFunction(count_fun, std::move(children), nullptr, AggregateType::NON_DISTINCT);
		aggr.expressions.push_back(std::move(count_aggr));
		constants.push_back(std::move(const_expr));
		rewrote_map.insert(i);
	}
	if (rewrote_map.empty()) {
		return;
	}
	vector<unique_ptr<Expression>> projection_expressions;
	// we rewrote aggregates - we need to push a projection in which we re-compute the original result
	idx_t rewritten_index = 0;
	auto proj_index = optimizer.binder.GenerateTableIndex();
	for (idx_t i = 0; i < aggr_count; i++) {
		ColumnBinding aggregate_binding(aggr.aggregate_index, i);
		aggregate_map[aggregate_binding] = ColumnBinding(proj_index, i);
		auto &aggr_type = aggr.expressions[i]->return_type;
		auto aggr_ref = make_uniq<BoundColumnRefExpression>(aggr_type, aggregate_binding);
		if (rewrote_map.find(i) == rewrote_map.end()) {
			// not rewritten - just push a reference
			projection_expressions.push_back(std::move(aggr_ref));
			continue;
		}
		// rewritten - need to compute the final result
		idx_t count_idx = aggr_count + rewritten_index;
		ColumnBinding count_binding(aggr.aggregate_index, count_idx);
		auto count_ref = make_uniq<BoundColumnRefExpression>(aggr.expressions[count_idx]->return_type, count_binding);

		// cast the count to the sum type
		auto cast_count = BoundCastExpression::AddCastToType(optimizer.context, std::move(count_ref), aggr_type);
		auto const_expr =
		    BoundCastExpression::AddCastToType(optimizer.context, std::move(constants[rewritten_index]), aggr_type);

		// bind the multiplication
		auto multiply = optimizer.BindScalarFunction("*", std::move(cast_count), std::move(const_expr));

		// add it to the sum
		auto final_result = optimizer.BindScalarFunction("+", std::move(aggr_ref), std::move(multiply));
		projection_expressions.push_back(std::move(final_result));

		rewritten_index++;
	}

	// push the projection to replace the aggregate
	auto proj = make_uniq<LogicalProjection>(proj_index, std::move(projection_expressions));
	if (op->has_estimated_cardinality) {
		proj->SetEstimatedCardinality(op->estimated_cardinality);
	}
	proj->children.push_back(std::move(op));
	op = std::move(proj);
}